

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_free_air(void)

{
  if (fsnav->air != (fsnav_air *)0x0) {
    fsnav->air->cfg = (char *)0x0;
    fsnav->air->cfglength = 0;
    free(fsnav->air);
  }
  return;
}

Assistant:

void fsnav_free_air(void)
{
	if (fsnav->air == NULL)
		return;
	
	// configuration
	fsnav->air->cfg = NULL;
	fsnav->air->cfglength = 0;
	
	// air data
	free((void*)(fsnav->air));
}